

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createCylinderShapeZ
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  undefined8 local_20;
  btScalar local_18;
  btScalar local_14;
  
  this_00 = (btCollisionShape *)btCylinderShapeZ::operator_new(0x48);
  local_20 = (btCollisionShape *)CONCAT44(radius,radius);
  local_14 = 0.0;
  local_18 = height;
  btCylinderShapeZ::btCylinderShapeZ((btCylinderShapeZ *)this_00,(btVector3 *)&local_20);
  local_20 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(btCollisionShape **)&local_20);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCylinderShapeZ(btScalar radius,btScalar height)
{
	btCylinderShapeZ* shape = new btCylinderShapeZ(btVector3(radius,radius,height));
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}